

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O0

SRes SZIP_ISeekInStream_Read(void *p,void *buf,size_t *size)

{
  undefined8 local_50;
  PHYSFS_sint64 rc;
  PHYSFS_uint64 len;
  PHYSFS_Io *io;
  SZIPLookToRead *stream;
  size_t *size_local;
  void *buf_local;
  void *p_local;
  
  if (*size == 0) {
    local_50 = 0;
  }
  else {
    local_50 = (**(code **)(*(long *)((long)p + 0x10) + 0x10))(*(long *)((long)p + 0x10),buf,*size);
  }
  if ((long)local_50 < 0) {
    *size = 0;
    p_local._4_4_ = 8;
  }
  else {
    *size = local_50;
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static SRes SZIP_ISeekInStream_Read(void *p, void *buf, size_t *size)
{
    SZIPLookToRead *stream = (SZIPLookToRead *) p;
    PHYSFS_Io *io = stream->io;
    const PHYSFS_uint64 len = (PHYSFS_uint64) *size;
    const PHYSFS_sint64 rc = (len == 0) ? 0 : io->read(io, buf, len);

    if (rc < 0)
    {
        *size = 0;
        return SZ_ERROR_READ;
    } /* if */

    *size = (size_t) rc;
    return SZ_OK;
}